

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_to_n32_unsafe.cc
# Opt level: O1

bool s_to_u32_unsafe(char *s,char *s_end,uint32_t *number)

{
  char *pcVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = s == s_end;
  if (!bVar3) {
    uVar2 = (ulong)((int)*s - 0x30U);
    if ((int)*s - 0x30U != 0xffffffff) {
      pcVar1 = s + 1;
      do {
        bVar3 = pcVar1 == s_end;
        if (bVar3) goto LAB_00147d9e;
        uVar2 = (ulong)((int)*pcVar1 - 0x30) + uVar2 * 10;
        pcVar1 = pcVar1 + 1;
      } while (uVar2 < 0xffffffff);
    }
    return bVar3;
  }
  uVar2 = 0;
LAB_00147d9e:
  *number = (uint32_t)uVar2;
  return bVar3;
}

Assistant:

bool s_to_u32_unsafe (const char * s, const char * s_end, uint32_t & number)
{
	uint64_t u = 0;
	for (; s != s_end; ++s)
	{
		u *= 10;
		u += static_cast<uint32_t> (*s) - 0x30;
		if (u >= std::numeric_limits<uint32_t>::max())
		{
			return false;
		}
	}
	number = static_cast<uint32_t> (u);
	return true;
}